

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O3

StringTree * capnp::operator*(StringTree *__return_storage_ptr__,int64_t *param_2)

{
  Reader local_50;
  
  local_50.type = STRUCT;
  local_50.field_1.intValue = *param_2;
  local_50.field_1.textValue.super_StringPtr.content.size_ = param_2[1];
  local_50.field_1.listValue.reader.segment = (SegmentReader *)param_2[2];
  local_50.field_1.listValue.reader.capTable = (CapTableReader *)param_2[3];
  local_50.field_1.listValue.reader.ptr = (byte *)param_2[4];
  local_50.field_1._40_8_ = param_2[5];
  local_50.field_1._48_8_ = param_2[6];
  anon_unknown_2::print(__return_storage_ptr__,&local_50,STRUCT,(Indent)0x0,BARE);
  DynamicValue::Reader::~Reader(&local_50);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree KJ_STRINGIFY(const DynamicStruct::Reader& value) { return stringify(value); }